

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall dtc::fdt::property_value::resolve_type(property_value *this)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  value_type vVar6;
  int iVar7;
  byte *pbVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  int local_38;
  
  if (this->type != UNKNOWN) {
    return;
  }
  pbVar8 = (this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 == pbVar2) {
    vVar6 = STRING;
  }
  else {
    vVar6 = BINARY;
    if (pbVar2[-1] == 0) {
      if (pbVar8 == pbVar2) {
        bVar11 = true;
        iVar9 = 0;
        local_38 = 0;
        bVar3 = true;
      }
      else {
        iVar7 = (int)pbVar8;
        local_38 = 0;
        iVar9 = 1;
        bVar3 = true;
        bVar11 = false;
        do {
          bVar1 = *pbVar8;
          bVar10 = true;
          if (bVar1 != 0) {
            iVar5 = isprint((uint)bVar1);
            bVar10 = iVar5 != 0;
          }
          bVar3 = (bool)(bVar3 & bVar10);
          if (bVar1 == 0) {
            if (!bVar11) {
              local_38 = local_38 + 1;
              bVar11 = true;
              goto LAB_00120a1f;
            }
            this->type = BINARY;
            cVar4 = '\x01';
            bVar10 = false;
          }
          else {
            bVar11 = false;
LAB_00120a1f:
            cVar4 = !bVar3 * '\x02';
            bVar10 = bVar3;
          }
          if (!bVar10) goto LAB_00120a45;
          pbVar8 = pbVar8 + 1;
          iVar9 = iVar9 + 1;
        } while (pbVar8 != pbVar2);
        cVar4 = '\x02';
        iVar9 = (int)pbVar2 - iVar7;
LAB_00120a45:
        bVar11 = cVar4 == '\x02';
      }
      vVar6 = BINARY;
      if (!bVar11) {
        return;
      }
      if (bVar3) {
        if (iVar9 != 0 && iVar9 <= local_38) goto LAB_00120a5b;
      }
      else if (iVar9 != 0) goto LAB_00120a5b;
      vVar6 = (value_type)(local_38 < 2);
    }
  }
LAB_00120a5b:
  this->type = vVar6;
  return;
}

Assistant:

void
property_value::resolve_type()
{
	if (type != UNKNOWN)
	{
		return;
	}
	if (byte_data.empty())
	{
		type = STRING;
		return;
	}
	if (byte_data.back() == 0)
	{
		bool is_all_printable = true;
		int nuls = 0;
		int bytes = 0;
		bool lastWasNull = false;
		for (auto i : byte_data)
		{
			bytes++;
			is_all_printable &= (i == '\0') || isprint(i);
			if (i == '\0')
			{
				// If there are two nulls in a row, then we're probably binary.
				if (lastWasNull)
				{
					type = BINARY;
					return;
				}
				nuls++;
				lastWasNull = true;
			}
			else
			{
				lastWasNull = false;
			}
			if (!is_all_printable)
			{
				break;
			}
		}
		if ((is_all_printable && (bytes > nuls)) || bytes == 0)
		{
			type = STRING;
			if (nuls > 1)
			{
				type = STRING_LIST;
			}
			return;
		}
	}
	type = BINARY;
}